

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wycheproof_util.cc
# Opt level: O2

bool GetWycheproofResult(FileTest *t,WycheproofResult *out)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  ulong uVar4;
  WycheproofRawResult WVar5;
  allocator<char> local_91;
  string flags;
  string result;
  string local_50;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flags,"result",(allocator<char> *)&local_50);
  bVar1 = FileTest::GetAttribute(t,&result,&flags);
  std::__cxx11::string::~string((string *)&flags);
  WVar5 = kValid;
  if (bVar1) {
    bVar1 = std::operator==(&result,"valid");
    if (!bVar1) {
      bVar1 = std::operator==(&result,"invalid");
      if (bVar1) {
        WVar5 = kInvalid;
      }
      else {
        bVar1 = std::operator==(&result,"acceptable");
        if (!bVar1) {
          WVar5 = kValid;
          FileTest::PrintLine(t,"Bad result string \'%s\'",result._M_dataplus._M_p);
          goto LAB_003a2fcb;
        }
        WVar5 = kAcceptable;
      }
    }
    out->raw_result = WVar5;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&out->flags);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags,"flags",(allocator<char> *)&local_50);
    bVar1 = FileTest::HasAttribute(t,&flags);
    std::__cxx11::string::~string((string *)&flags);
    WVar5 = kInvalid;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"flags",&local_91);
      psVar2 = FileTest::GetAttributeOrDie(t,&local_50);
      std::__cxx11::string::string((string *)&flags,(string *)psVar2);
      std::__cxx11::string::~string((string *)&local_50);
      uVar4 = 0;
      while (uVar4 < flags._M_string_length) {
        sVar3 = std::__cxx11::string::find((char)&flags,0x2c);
        if (sVar3 == 0xffffffffffffffff) {
          sVar3 = flags._M_string_length;
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&flags);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&out->flags,
                   &local_50);
        std::__cxx11::string::~string((string *)&local_50);
        uVar4 = sVar3 + 1;
      }
      std::__cxx11::string::~string((string *)&flags);
      WVar5 = kInvalid;
    }
  }
LAB_003a2fcb:
  std::__cxx11::string::~string((string *)&result);
  return SUB41(WVar5,0);
}

Assistant:

bool GetWycheproofResult(FileTest *t, WycheproofResult *out) {
  std::string result;
  if (!t->GetAttribute(&result, "result")) {
    return false;
  }
  if (result == "valid") {
    out->raw_result = WycheproofRawResult::kValid;
  } else if (result == "invalid") {
    out->raw_result = WycheproofRawResult::kInvalid;
  } else if (result == "acceptable") {
    out->raw_result = WycheproofRawResult::kAcceptable;
  } else {
    t->PrintLine("Bad result string '%s'", result.c_str());
    return false;
  }

  out->flags.clear();
  if (t->HasAttribute("flags")) {
    std::string flags = t->GetAttributeOrDie("flags");
    size_t idx = 0;
    while (idx < flags.size()) {
      size_t comma = flags.find(',', idx);
      if (comma == std::string::npos) {
        comma = flags.size();
      }
      out->flags.push_back(flags.substr(idx, comma - idx));
      idx = comma + 1;
    }
  }
  return true;
}